

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O3

string * __thiscall
StringInstance::op_insert_beforeIndex
          (string *__return_storage_ptr__,StringInstance *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *arguments)

{
  string *str;
  int iVar1;
  bool bVar2;
  undefined8 *puVar3;
  char *pcVar4;
  ulong uVar5;
  undefined1 *local_c0 [2];
  undefined1 local_b0 [16];
  StringInstance local_a0;
  
  str = (arguments->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start;
  if ((long)(arguments->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish - (long)str == 0x40) {
    bVar2 = Grammar::is_string_value(str);
    if (bVar2) {
      IntegerInstance::IntegerInstance
                ((IntegerInstance *)&local_a0,
                 (arguments->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + 1);
      iVar1 = (int)local_a0._value._M_dataplus._M_p;
      uVar5 = (ulong)(int)local_a0._value._M_dataplus._M_p;
      CharacterInstance::~CharacterInstance((CharacterInstance *)&local_a0);
      if ((-1 < (long)uVar5) && (iVar1 <= (int)(this->_value)._M_string_length)) {
        StringInstance(&local_a0,
                       (arguments->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start);
        local_c0[0] = local_b0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_c0,
                   CONCAT44(local_a0._value._M_dataplus._M_p._4_4_,
                            (int)local_a0._value._M_dataplus._M_p),
                   local_a0._value._M_string_length +
                   CONCAT44(local_a0._value._M_dataplus._M_p._4_4_,
                            (int)local_a0._value._M_dataplus._M_p));
        std::__cxx11::string::replace((ulong)&this->_value,uVar5,(char *)0x0,(ulong)local_c0[0]);
        if (local_c0[0] != local_b0) {
          operator_delete(local_c0[0]);
        }
        ~StringInstance(&local_a0);
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"null","");
        return __return_storage_ptr__;
      }
    }
    puVar3 = (undefined8 *)__cxa_allocate_exception(8);
    pcVar4 = "RuntimeError: invalid argument.";
  }
  else {
    puVar3 = (undefined8 *)__cxa_allocate_exception(8);
    pcVar4 = "RuntimeError: wrong number of arguments.";
  }
  *puVar3 = pcVar4;
  __cxa_throw(puVar3,&char_const*::typeinfo,0);
}

Assistant:

std::string StringInstance::op_insert_beforeIndex(const std::vector<std::string>& arguments) {
    if (arguments.size() != 2)
        throw EXC_WRONG_NUMBER_OF_ARGUMENTS;
    if (!Grammar::is_string_value(arguments[0]))
        throw EXC_INVALID_ARGUMENT;
    int index = IntegerInstance(arguments[1]).value();
    if (index < 0 || index > int(_value.size()))
        throw EXC_INVALID_ARGUMENT;
    _value.insert(index, StringInstance(arguments[0]).value());
    return "null";
}